

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_internal.cc
# Opt level: O0

Nonnull<const_char_*>
absl::lts_20250127::status_internal::MakeCheckFailString
          (Nonnull<const_absl::Status_*> status,Nonnull<const_char_*> prefix)

{
  string *__return_storage_ptr__;
  Nonnull<const_char_*> pcVar1;
  AlphaNum *in_R9;
  AlphaNum local_108;
  string local_d8;
  AlphaNum local_b8;
  AlphaNum local_88;
  AlphaNum local_48;
  Nullable<const_char_*> local_18;
  Nonnull<const_char_*> prefix_local;
  Nonnull<const_absl::Status_*> status_local;
  
  local_18 = prefix;
  prefix_local = (Nonnull<const_char_*>)status;
  __return_storage_ptr__ = (string *)operator_new(0x20);
  AlphaNum::AlphaNum(&local_48,local_18);
  AlphaNum::AlphaNum(&local_88," (");
  Status::ToString_abi_cxx11_(&local_d8,(Status *)prefix_local,kWithEverything);
  AlphaNum::AlphaNum<std::allocator<char>>(&local_b8,&local_d8);
  AlphaNum::AlphaNum(&local_108,")");
  StrCat_abi_cxx11_(__return_storage_ptr__,(lts_20250127 *)&local_48,&local_88,&local_b8,&local_108,
                    in_R9);
  IgnoreLeak<std::__cxx11::string>(__return_storage_ptr__);
  pcVar1 = (Nonnull<const_char_*>)std::__cxx11::string::c_str();
  std::__cxx11::string::~string((string *)&local_d8);
  return pcVar1;
}

Assistant:

absl::Nonnull<const char*> MakeCheckFailString(
    absl::Nonnull<const absl::Status*> status,
    absl::Nonnull<const char*> prefix) {
  // There's no need to free this string since the process is crashing.
  return absl::IgnoreLeak(
             new std::string(absl::StrCat(
                 prefix, " (",
                 status->ToString(StatusToStringMode::kWithEverything), ")")))
      ->c_str();
}